

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

int binbuf_getpos(_binbuf *b,int *x0,int *y0,t_symbol **type)

{
  int iVar1;
  int iVar2;
  t_symbol *ptVar3;
  t_symbol *ptVar4;
  t_float tVar5;
  int local_64;
  int off;
  int stack;
  t_atom *ap;
  int ac;
  t_symbol *s;
  int count;
  int argc0;
  int argc;
  t_atom *argv;
  t_symbol **type_local;
  int *y0_local;
  int *x0_local;
  _binbuf *b_local;
  
  _off = binbuf_getvec(b);
  iVar1 = binbuf_getnatom(b);
  s._4_4_ = 0;
  count = iVar1;
  _argc0 = _off;
  if ((2 < iVar1) && (ptVar3 = atom_getsymbol(_off), ptVar3 == &s__N)) {
    ptVar3 = atom_getsymbol(_off + 1);
    ptVar4 = gensym("canvas");
    if (ptVar3 == ptVar4) {
      local_64 = 0;
      ap._4_4_ = iVar1;
      _argc0 = _off;
      do {
        iVar2 = binbuf_nextmess(count,_argc0);
        if (iVar2 == 0) break;
        ap._4_4_ = count;
        _off = _argc0;
        count = count - iVar2;
        s._4_4_ = iVar2 + s._4_4_;
        if (1 < iVar2) {
          ptVar3 = atom_getsymbol(_argc0 + 1);
          ptVar4 = gensym("restore");
          if ((ptVar3 == ptVar4) && (ptVar3 = atom_getsymbol(_argc0), ptVar3 == &s__X)) {
            local_64 = local_64 + -1;
          }
          ptVar3 = atom_getsymbol(_argc0 + 1);
          ptVar4 = gensym("canvas");
          if ((ptVar3 == ptVar4) && (ptVar3 = atom_getsymbol(_argc0), ptVar3 == &s__N)) {
            local_64 = local_64 + 1;
          }
        }
        if (count < 0) {
          return 0;
        }
        _argc0 = _argc0 + iVar2;
      } while (0 < local_64);
      count = ap._4_4_;
      _argc0 = _off;
    }
  }
  if ((count < 4) || (ptVar3 = atom_getsymbol(_argc0), ptVar3 != &s__X)) {
    b_local._4_4_ = 0;
  }
  else {
    ptVar3 = atom_getsymbol(_argc0 + 1);
    ptVar4 = gensym("restore");
    if (((((ptVar4 == ptVar3) || (ptVar4 = gensym("obj"), ptVar4 == ptVar3)) ||
         (ptVar4 = gensym("msg"), ptVar4 == ptVar3)) ||
        ((ptVar4 = gensym("text"), ptVar4 == ptVar3 ||
         (ptVar4 = gensym("floatatom"), ptVar4 == ptVar3)))) ||
       ((ptVar4 = gensym("listbox"), ptVar4 == ptVar3 ||
        (ptVar4 = gensym("symbolatom"), ptVar4 == ptVar3)))) {
      if (x0 != (int *)0x0) {
        tVar5 = atom_getfloat(_argc0 + 2);
        *x0 = (int)tVar5;
      }
      if (y0 != (int *)0x0) {
        tVar5 = atom_getfloat(_argc0 + 3);
        *y0 = (int)tVar5;
      }
      if (type != (t_symbol **)0x0) {
        *type = ptVar3;
      }
      for (; (count != 0 && (s._4_4_ = s._4_4_ + 1, _argc0->a_type != A_SEMI)); _argc0 = _argc0 + 1)
      {
        count = count + -1;
      }
      b_local._4_4_ = (s._4_4_ < iVar1) + 1;
    }
    else {
      b_local._4_4_ = 0;
    }
  }
  return b_local._4_4_;
}

Assistant:

static int binbuf_getpos(t_binbuf*b, int *x0, int *y0, t_symbol**type)
{
        /*
         * checks how many objects the binbuf contains and where they are located
         * for simplicity, we stop after the first object...
         * "objects" are any patchable things
         * returns: 0: no objects/...
         *          1: single object in binbuf
         *          2: more than one object in binbuf
         * (x0,y0) are the coordinates of the first object
         * (type) is the type of the first object ("obj", "msg",...)
         */
    t_atom*argv = binbuf_getvec(b);
    int argc = binbuf_getnatom(b);
    const int argc0 = argc;
    int count = 0;
    t_symbol*s;
        /* get the position of the first object in the argv binbuf */
    if(argc > 2
       && atom_getsymbol(argv+0) == &s__N
       && atom_getsymbol(argv+1) == gensym("canvas"))
    {
        int ac = argc;
        t_atom*ap = argv;
        int stack = 0;
        do {
            int off = binbuf_nextmess(argc, argv);
            if(!off)
                break;
            ac = argc;
            ap = argv;
            argc-=off;
            argv+=off;
            count+=off;
            if(off >= 2)
            {
                if (atom_getsymbol(ap+1) == gensym("restore")
                    && atom_getsymbol(ap) == &s__X)
                    {
                        stack--;
                    }
                if (atom_getsymbol(ap+1) == gensym("canvas")
                    && atom_getsymbol(ap) == &s__N)
                    {
                        stack++;
                    }
            }
            if(argc<0)
                return 0;
        } while (stack>0);
        argc = ac;
        argv = ap;
    }
    if(argc < 4 || atom_getsymbol(argv) != &s__X)
        return 0;
        /* #X obj|msg|text|floatatom|symbolatom <x> <y> ...
         * TODO: subpatches #N canvas + #X restore <x> <y>
         */
    s = atom_getsymbol(argv+1);
    if(gensym("restore") == s
       || gensym("obj") == s
       || gensym("msg") == s
       || gensym("text") == s
       || gensym("floatatom") == s
       || gensym("listbox") == s
       || gensym("symbolatom") == s)
    {
        if(x0)*x0=atom_getfloat(argv+2);
        if(y0)*y0=atom_getfloat(argv+3);
        if(type)*type=s;
    } else
        return 0;

        /* no wind the binbuf to the next message */
    while(argc--)
    {
        count++;
        if (A_SEMI == argv->a_type)
            break;
        argv++;
    }
    return 1+(argc0 > count);
}